

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O2

VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs> __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll
          (LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this)

{
  anon_class_8_1_8991fb9c_for__func in_RSI;
  undefined8 local_158;
  undefined8 uStack_150;
  long local_148;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>_>
  local_138;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>_>
  local_d0;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:60:17),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  local_80;
  
  local_148 = (long)((in_RSI.this)->_trees)._cursor - (long)((in_RSI.this)->_trees)._stack >> 3;
  local_158 = 0;
  uStack_150 = 0;
  Lib::IterTraits<Lib::RangeIterator<unsigned_long>>::
  flatMap<Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::_lambda(auto:1)_1_>
            (&local_d0,(IterTraits<Lib::RangeIterator<unsigned_long>> *)&local_158,in_RSI);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::{lambda(auto:1)#1},Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>>>
  ::
  flatMap<Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::_lambda(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Leaf*)_1_>
            (&local_138,&local_d0);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::{lambda(auto:1)#1},Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::{lambda(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Leaf*)#1},Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>>>>
  ::
  map<Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs_const*)_1_>
            (&local_80,&local_138);
  Lib::
  pvi<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::_lambda(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Leaf*)_1_,Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>>>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs_const*)_1_,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>
            ((Lib *)this,&local_80);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>_>
  ::~FlatteningIterator(&local_80._iter._inner);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>_>
  ::~FlatteningIterator(&local_138);
  Lib::
  OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
  ::~OptionBase(&local_d0._iter._current.
                 super_OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
               );
  return (VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs>)
         (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Rhs> *)this;
}

Assistant:

VirtualIterator<LeafData> getAll() final override
  {
    return pvi(
          iterTraits(getRangeIterator((unsigned long)0, _trees.size()))
           .flatMap([this](auto i) { return LeafIterator(_trees[i].get()); })
           .flatMap([](Leaf* l) { return l->allChildren(); })
           // TODO get rid of copying data here
           .map([](LeafData const* ld) { return *ld; })
        );
  }